

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printLevelMode(LevelMode lm)

{
  ostream *this;
  int in_EDI;
  
  if (in_EDI == 0) {
    std::operator<<((ostream *)&std::cout,"single level");
  }
  else if (in_EDI == 1) {
    std::operator<<((ostream *)&std::cout,"mip-map");
  }
  else if (in_EDI == 2) {
    std::operator<<((ostream *)&std::cout,"rip-map");
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"level mode ");
    std::ostream::operator<<(this,in_EDI);
  }
  return;
}

Assistant:

void
printLevelMode (LevelMode lm)
{
    switch (lm)
    {
        case ONE_LEVEL: cout << "single level"; break;

        case MIPMAP_LEVELS: cout << "mip-map"; break;

        case RIPMAP_LEVELS: cout << "rip-map"; break;

        default: cout << "level mode " << int (lm); break;
    }
}